

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * __thiscall
httplib::SocketStream::get_remote_addr_abi_cxx11_(string *__return_storage_ptr__,SocketStream *this)

{
  int iVar1;
  size_t sVar2;
  socklen_t len;
  sockaddr_storage addr;
  socklen_t local_49c;
  sockaddr local_498 [8];
  char local_418 [1032];
  
  local_49c = 0x80;
  iVar1 = getpeername(this->sock_,local_498,&local_49c);
  if ((iVar1 == 0) &&
     (iVar1 = getnameinfo(local_498,local_49c,local_418,0x401,(char *)0x0,0,1), iVar1 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(local_418);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_418,local_418 + sVar2);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline std::string SocketStream::get_remote_addr() const {
    return detail::get_remote_addr(sock_);
}